

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicodelib.h
# Opt level: O0

NormalizationProperties *
unicode::_normalization_properties::get_value
          (NormalizationProperties *__return_storage_ptr__,char32_t cp)

{
  undefined8 *puVar1;
  long lVar2;
  size_t off;
  NormalizationProperties *bl;
  size_t i;
  char32_t cp_local;
  
  if (*(long *)(_blocks + (ulong)((uint)cp >> 7) * 8) == 0) {
    lVar2 = (ulong)((uint)cp >> 7) * 0x18;
    *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)(_block_values + lVar2);
    __return_storage_ptr__->compat_format = *(char **)(_block_values + lVar2 + 8);
    __return_storage_ptr__->codes = *(char32_t **)(_block_values + lVar2 + 0x10);
  }
  else {
    puVar1 = (undefined8 *)
             (*(long *)(_blocks + (ulong)((uint)cp >> 7) * 8) + ((ulong)(uint)cp & 0x7f) * 0x18);
    *(undefined8 *)__return_storage_ptr__ = *puVar1;
    __return_storage_ptr__->compat_format = (char *)puVar1[1];
    __return_storage_ptr__->codes = (char32_t *)puVar1[2];
  }
  return __return_storage_ptr__;
}

Assistant:

inline NormalizationProperties get_value(char32_t cp) {
  auto i = cp / _block_size;
  auto bl = _blocks[i];
  if (bl) {
    auto off = cp % _block_size;
    return bl[off];
  }
  return _block_values[i];
}